

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_3.cpp
# Opt level: O0

string * remove_vowels(string *line)

{
  bool bVar1;
  reference pcVar2;
  char *ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  ostringstream oss;
  string *line_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range1);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  ch = (char *)std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&ch);
    if (!bVar1) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    bVar1 = is_vowel(*pcVar2);
    if (!bVar1) {
      std::operator<<((ostream *)&__range1,*pcVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range1);
  return line;
}

Assistant:

std::string remove_vowels(const std::string& line)
{
	std::ostringstream oss;
	for (auto& ch : line)
	{
		if (!is_vowel(ch))
		{
			oss << ch;
		}
	}
	return oss.str();
}